

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_opendir(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_vm *pjVar1;
  int iVar2;
  jx9_io_stream *pjVar3;
  io_private *pDev;
  char *zErr;
  jx9_value *pjVar4;
  char *zPath;
  int iLen;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    zErr = "Expecting a directory path";
    iVar2 = 2;
  }
  else {
    zPath = jx9_value_to_string(*apArg,&iLen);
    pjVar3 = jx9VmGetStreamDevice(pCtx->pVm,&zPath,iLen);
    if (pjVar3 == (jx9_io_stream *)0x0) {
      jx9_context_throw_error_format
                (pCtx,2,"No stream device is associated with the given path(%s)",zPath);
      goto LAB_00135824;
    }
    if (pjVar3->xOpenDir == (_func_int_char_ptr_jx9_value_ptr_void_ptr_ptr *)0x0) {
      jx9_context_throw_error_format
                (pCtx,2,"IO routine(%s) not implemented in the underlying stream(%s) device",
                 (pCtx->pFunc->sName).zString,pjVar3->zName);
      goto LAB_00135824;
    }
    pDev = (io_private *)jx9_context_alloc_chunk(pCtx,0x38,1,0);
    if (pDev != (io_private *)0x0) {
      pjVar1 = pCtx->pVm;
      pDev->pStream = pjVar3;
      (pDev->sBuffer).pBlob = (void *)0x0;
      (pDev->sBuffer).nByte = 0;
      (pDev->sBuffer).mByte = 0;
      (pDev->sBuffer).pAllocator = &pjVar1->sAllocator;
      (pDev->sBuffer).nFlags = 0;
      pDev->nOfft = 0;
      pDev->iMagic = 0xfeac14;
      if (nArg == 1) {
        pjVar4 = (jx9_value *)0x0;
      }
      else {
        pjVar4 = apArg[1];
      }
      iVar2 = (*pjVar3->xOpenDir)(zPath,pjVar4,&pDev->pHandle);
      if (iVar2 == 0) {
        jx9_result_resource(pCtx,pDev);
        return 0;
      }
      ReleaseIOPrivate(pCtx,pDev);
      goto LAB_00135824;
    }
    zErr = "JX9 is running out of memory";
    iVar2 = 1;
  }
  jx9_context_throw_error(pCtx,iVar2,zErr);
LAB_00135824:
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_opendir(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	const char *zPath;
	io_private *pDev;
	int iLen, rc;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a directory path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the target path */
	zPath  = jx9_value_to_string(apArg[0], &iLen);
	/* Try to extract a stream */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zPath, iLen);
	if( pStream == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"No stream device is associated with the given path(%s)", zPath);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( pStream->xOpenDir == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device", 
			jx9_function_name(pCtx), pStream->zName
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Allocate a new IO private instance */
	pDev = (io_private *)jx9_context_alloc_chunk(pCtx, sizeof(io_private), TRUE, FALSE);
	if( pDev == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Initialize the structure */
	InitIOPrivate(pCtx->pVm, pStream, pDev);
	/* Open the target directory */
	rc = pStream->xOpenDir(zPath, nArg > 1 ? apArg[1] : 0, &pDev->pHandle);
	if( rc != JX9_OK ){
		/* IO error, return FALSE */
		ReleaseIOPrivate(pCtx, pDev);
		jx9_result_bool(pCtx, 0);
	}else{
		/* Return the handle as a resource */
		jx9_result_resource(pCtx, pDev);
	}
	return JX9_OK;
}